

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O0

int arkGetResWeights(void *arkode_mem,N_Vector rweight)

{
  realtype in_RDI;
  ARKodeMem ark_mem;
  N_Vector in_stack_ffffffffffffffd8;
  int local_4;
  
  if (in_RDI == 0.0) {
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode","arkGetResWeights","arkode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else {
    N_VScale(in_RDI,in_stack_ffffffffffffffd8,(N_Vector)0xead60d);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int arkGetResWeights(void *arkode_mem, N_Vector rweight)
{
  ARKodeMem ark_mem;
  if (arkode_mem==NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode",
                    "arkGetResWeights", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem) arkode_mem;

  N_VScale(ONE, ark_mem->rwt, rweight);
  return(ARK_SUCCESS);
}